

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoumax.c
# Opt level: O0

uintmax_t strtoumax(char *__nptr,char **__endptr,int __base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *local_50;
  char **local_48;
  char **local_40;
  char *p;
  char sign;
  uintmax_t rc;
  char **ppcStack_20;
  int base_local;
  char **endptr_local;
  char *nptr_local;
  
  p._7_1_ = '+';
  rc._4_4_ = __base;
  ppcStack_20 = __endptr;
  endptr_local = (char **)__nptr;
  local_40 = (char **)_PDCLIB_strtox_prelim(__nptr,(char *)((long)&p + 7),(int *)((long)&rc + 4));
  if (((int)rc._4_4_ < 2) || (0x24 < (int)rc._4_4_)) {
    nptr_local = (char *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)rc._4_4_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)rc._4_4_;
    local_50 = (char *)_PDCLIB_strtox_main((char **)&local_40,rc._4_4_,0xffffffffffffffff,
                                           SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff))
                                                  / auVar1,0),
                                           SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff))
                                                  % auVar2,0),(char *)((long)&p + 7));
    if (ppcStack_20 != (char **)0x0) {
      if (local_40 == (char **)0x0) {
        local_48 = endptr_local;
      }
      else {
        local_48 = local_40;
      }
      *ppcStack_20 = (char *)local_48;
    }
    if (p._7_1_ != '+') {
      local_50 = (char *)-(long)local_50;
    }
    nptr_local = local_50;
  }
  return (uintmax_t)nptr_local;
}

Assistant:

uintmax_t strtoumax( const char * _PDCLIB_restrict nptr, char ** _PDCLIB_restrict endptr, int base )
{
    uintmax_t rc;
    char sign = '+';
    const char * p = _PDCLIB_strtox_prelim( nptr, &sign, &base );

    if ( base < 2 || base > 36 )
    {
        return 0;
    }

    rc = _PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )UINTMAX_MAX, ( uintmax_t )( UINTMAX_MAX / base ), ( int )( UINTMAX_MAX % base ), &sign );

    if ( endptr != NULL )
    {
        *endptr = ( p != NULL ) ? ( char * ) p : ( char * ) nptr;
    }

    return ( sign == '+' ) ? rc : -rc;
}